

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_options.c
# Opt level: O0

int archive_set_filter_option(archive *_a,char *m,char *o,char *v)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  int rv;
  int r;
  archive_write_filter *filter;
  archive_write *a;
  int local_40;
  long local_38;
  
  local_40 = -0x14;
  local_38 = *(long *)(in_RDI + 0xc0);
  do {
    if (local_38 == 0) {
      if ((local_40 == -0x14) && (in_RSI != (char *)0x0)) {
        local_40 = -0x15;
      }
      return local_40;
    }
    if ((*(long *)(local_38 + 0x18) != 0) &&
       ((in_RSI == (char *)0x0 || (iVar1 = strcmp(*(char **)(local_38 + 0x48),in_RSI), iVar1 == 0)))
       ) {
      iVar1 = (**(code **)(local_38 + 0x18))(local_38,in_RDX,in_RCX);
      if (iVar1 == -0x1e) {
        return -0x1e;
      }
      if (in_RSI != (char *)0x0) {
        return iVar1;
      }
      if (iVar1 == 0) {
        local_40 = 0;
      }
    }
    local_38 = *(long *)(local_38 + 0x10);
  } while( true );
}

Assistant:

static int
archive_set_filter_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter;
	struct archive_read_filter_bidder *bidder;
	int r, rv = ARCHIVE_WARN, matched_modules = 0;

	for (filter = a->filter; filter != NULL; filter = filter->upstream) {
		bidder = filter->bidder;
		if (bidder == NULL)
			continue;
		if (bidder->options == NULL)
			/* This bidder does not support option */
			continue;
		if (m != NULL) {
			if (strcmp(filter->name, m) != 0)
				continue;
			++matched_modules;
		}

		r = bidder->options(bidder, o, v);

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the filter name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL && matched_modules == 0)
		return ARCHIVE_WARN - 1;
	return (rv);
}